

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  undefined4 uVar3;
  ulong uVar4;
  Scene *pSVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 (*pauVar71) [16];
  int iVar72;
  uint uVar73;
  long lVar74;
  long lVar75;
  ulong uVar76;
  long lVar77;
  uint uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  undefined1 (*pauVar83) [16];
  ulong uVar84;
  ulong uVar85;
  undefined4 uVar86;
  ulong unaff_R13;
  float fVar94;
  undefined1 auVar87 [16];
  float fVar96;
  undefined1 auVar88 [32];
  float fVar95;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  float fVar97;
  float fVar98;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar100 [32];
  float fVar106;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar119;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar114 [32];
  undefined1 auVar113 [16];
  undefined1 auVar115 [32];
  float fVar121;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar131;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar128 [32];
  float fVar132;
  float fVar136;
  float fVar137;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar140;
  float fVar141;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar145;
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar146;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar150 [64];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  float fVar159;
  float fVar160;
  undefined1 auVar161 [32];
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar162 [64];
  float fVar175;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar179 [64];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  float fVar189;
  undefined1 auVar190 [32];
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar191 [64];
  float fVar198;
  float fVar199;
  undefined1 auVar200 [32];
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar201 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  float fVar218;
  undefined1 auVar219 [32];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar220 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 local_1570;
  undefined8 uStack_1568;
  RTCFilterFunctionNArguments local_1550;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [16];
  undefined1 local_1490 [16];
  undefined1 local_1480 [16];
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  float local_12e0 [4];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  undefined4 uStack_12c4;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar83 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar86 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1450._4_4_ = uVar86;
  local_1450._0_4_ = uVar86;
  local_1450._8_4_ = uVar86;
  local_1450._12_4_ = uVar86;
  auVar158 = ZEXT1664(local_1450);
  uVar86 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1460._4_4_ = uVar86;
  local_1460._0_4_ = uVar86;
  local_1460._8_4_ = uVar86;
  local_1460._12_4_ = uVar86;
  auVar162 = ZEXT1664(local_1460);
  uVar86 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1470._4_4_ = uVar86;
  local_1470._0_4_ = uVar86;
  local_1470._8_4_ = uVar86;
  local_1470._12_4_ = uVar86;
  auVar179 = ZEXT1664(local_1470);
  fVar97 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar104 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar87 = ZEXT416((uint)(fVar97 * 0.99999964));
  local_1480 = vshufps_avx(auVar87,auVar87,0);
  auVar188 = ZEXT1664(local_1480);
  auVar87 = ZEXT416((uint)(fVar104 * 0.99999964));
  local_1490 = vshufps_avx(auVar87,auVar87,0);
  auVar191 = ZEXT1664(local_1490);
  auVar87 = ZEXT416((uint)(fVar2 * 0.99999964));
  local_14a0 = vshufps_avx(auVar87,auVar87,0);
  auVar201 = ZEXT1664(local_14a0);
  auVar87 = ZEXT416((uint)(fVar97 * 1.0000004));
  local_14b0 = vshufps_avx(auVar87,auVar87,0);
  auVar215 = ZEXT1664(local_14b0);
  auVar87 = ZEXT416((uint)(fVar104 * 1.0000004));
  local_14c0 = vshufps_avx(auVar87,auVar87,0);
  auVar217 = ZEXT1664(local_14c0);
  auVar87 = ZEXT416((uint)(fVar2 * 1.0000004));
  local_14d0 = vshufps_avx(auVar87,auVar87,0);
  auVar220 = ZEXT1664(local_14d0);
  uVar82 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar79 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar80 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar78 = 1 << ((byte)k & 0x1f);
  local_1240._16_16_ = mm_lookupmask_ps._240_16_;
  local_1240._0_16_ = mm_lookupmask_ps._0_16_;
  uVar76 = (ulong)((uVar78 & 0xf) << 4);
  lVar77 = (long)((int)uVar78 >> 4) * 0x10;
  auVar114._8_4_ = 0x3f800000;
  auVar114._0_8_ = &DAT_3f8000003f800000;
  auVar114._12_4_ = 0x3f800000;
  auVar114._16_4_ = 0x3f800000;
  auVar114._20_4_ = 0x3f800000;
  auVar114._24_4_ = 0x3f800000;
  auVar114._28_4_ = 0x3f800000;
  auVar88._8_4_ = 0xbf800000;
  auVar88._0_8_ = 0xbf800000bf800000;
  auVar88._12_4_ = 0xbf800000;
  auVar88._16_4_ = 0xbf800000;
  auVar88._20_4_ = 0xbf800000;
  auVar88._24_4_ = 0xbf800000;
  auVar88._28_4_ = 0xbf800000;
  local_1260 = vblendvps_avx(auVar114,auVar88,local_1240);
  iVar72 = (tray->tnear).field_0.i[k];
  local_14e0._4_4_ = iVar72;
  local_14e0._0_4_ = iVar72;
  local_14e0._8_4_ = iVar72;
  local_14e0._12_4_ = iVar72;
  auVar150 = ZEXT1664(local_14e0);
  iVar72 = (tray->tfar).field_0.i[k];
  auVar93 = ZEXT1664(CONCAT412(iVar72,CONCAT48(iVar72,CONCAT44(iVar72,iVar72))));
  do {
    do {
      do {
        if (pauVar83 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar71 = pauVar83 + -1;
        pauVar83 = pauVar83 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar71 + 8));
      uVar85 = *(ulong *)*pauVar83;
      do {
        if ((uVar85 & 8) == 0) {
          auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + uVar82),auVar158._0_16_);
          auVar99._0_4_ = auVar188._0_4_ * auVar87._0_4_;
          auVar99._4_4_ = auVar188._4_4_ * auVar87._4_4_;
          auVar99._8_4_ = auVar188._8_4_ * auVar87._8_4_;
          auVar99._12_4_ = auVar188._12_4_ * auVar87._12_4_;
          auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + uVar79),auVar162._0_16_);
          auVar110._0_4_ = auVar191._0_4_ * auVar87._0_4_;
          auVar110._4_4_ = auVar191._4_4_ * auVar87._4_4_;
          auVar110._8_4_ = auVar191._8_4_ * auVar87._8_4_;
          auVar110._12_4_ = auVar191._12_4_ * auVar87._12_4_;
          auVar87 = vmaxps_avx(auVar99,auVar110);
          auVar99 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + uVar80),auVar179._0_16_);
          auVar111._0_4_ = auVar201._0_4_ * auVar99._0_4_;
          auVar111._4_4_ = auVar201._4_4_ * auVar99._4_4_;
          auVar111._8_4_ = auVar201._8_4_ * auVar99._8_4_;
          auVar111._12_4_ = auVar201._12_4_ * auVar99._12_4_;
          auVar99 = vmaxps_avx(auVar111,auVar150._0_16_);
          auVar99 = vmaxps_avx(auVar87,auVar99);
          auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + (uVar82 ^ 0x10)),
                               auVar158._0_16_);
          auVar112._0_4_ = auVar215._0_4_ * auVar87._0_4_;
          auVar112._4_4_ = auVar215._4_4_ * auVar87._4_4_;
          auVar112._8_4_ = auVar215._8_4_ * auVar87._8_4_;
          auVar112._12_4_ = auVar215._12_4_ * auVar87._12_4_;
          auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + (uVar79 ^ 0x10)),
                               auVar162._0_16_);
          auVar125._0_4_ = auVar217._0_4_ * auVar87._0_4_;
          auVar125._4_4_ = auVar217._4_4_ * auVar87._4_4_;
          auVar125._8_4_ = auVar217._8_4_ * auVar87._8_4_;
          auVar125._12_4_ = auVar217._12_4_ * auVar87._12_4_;
          auVar87 = vminps_avx(auVar112,auVar125);
          auVar110 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + (uVar80 ^ 0x10)),
                                auVar179._0_16_);
          auVar126._0_4_ = auVar220._0_4_ * auVar110._0_4_;
          auVar126._4_4_ = auVar220._4_4_ * auVar110._4_4_;
          auVar126._8_4_ = auVar220._8_4_ * auVar110._8_4_;
          auVar126._12_4_ = auVar220._12_4_ * auVar110._12_4_;
          auVar110 = vminps_avx(auVar126,auVar93._0_16_);
          auVar87 = vminps_avx(auVar87,auVar110);
          auVar87 = vcmpps_avx(auVar99,auVar87,2);
          uVar86 = vmovmskps_avx(auVar87);
          unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar86);
          local_1420._0_16_ = auVar99;
        }
        if ((uVar85 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar72 = 4;
          }
          else {
            uVar84 = uVar85 & 0xfffffffffffffff0;
            lVar75 = 0;
            if (unaff_R13 != 0) {
              for (; (unaff_R13 >> lVar75 & 1) == 0; lVar75 = lVar75 + 1) {
              }
            }
            iVar72 = 0;
            uVar85 = *(ulong *)(uVar84 + lVar75 * 8);
            uVar81 = unaff_R13 - 1 & unaff_R13;
            if (uVar81 != 0) {
              uVar78 = *(uint *)(local_1420 + lVar75 * 4);
              lVar75 = 0;
              if (uVar81 != 0) {
                for (; (uVar81 >> lVar75 & 1) == 0; lVar75 = lVar75 + 1) {
                }
              }
              uVar4 = *(ulong *)(uVar84 + lVar75 * 8);
              uVar73 = *(uint *)(local_1420 + lVar75 * 4);
              uVar81 = uVar81 - 1 & uVar81;
              if (uVar81 == 0) {
                if (uVar78 < uVar73) {
                  *(ulong *)*pauVar83 = uVar4;
                  *(uint *)(*pauVar83 + 8) = uVar73;
                  pauVar83 = pauVar83 + 1;
                }
                else {
                  *(ulong *)*pauVar83 = uVar85;
                  *(uint *)(*pauVar83 + 8) = uVar78;
                  pauVar83 = pauVar83 + 1;
                  uVar85 = uVar4;
                }
              }
              else {
                auVar87._8_8_ = 0;
                auVar87._0_8_ = uVar85;
                auVar87 = vpunpcklqdq_avx(auVar87,ZEXT416(uVar78));
                auVar113._8_8_ = 0;
                auVar113._0_8_ = uVar4;
                auVar99 = vpunpcklqdq_avx(auVar113,ZEXT416(uVar73));
                lVar75 = 0;
                if (uVar81 != 0) {
                  for (; (uVar81 >> lVar75 & 1) == 0; lVar75 = lVar75 + 1) {
                  }
                }
                auVar127._8_8_ = 0;
                auVar127._0_8_ = *(ulong *)(uVar84 + lVar75 * 8);
                auVar111 = vpunpcklqdq_avx(auVar127,ZEXT416(*(uint *)(local_1420 + lVar75 * 4)));
                auVar110 = vpcmpgtd_avx(auVar99,auVar87);
                uVar81 = uVar81 - 1 & uVar81;
                if (uVar81 == 0) {
                  auVar112 = vpshufd_avx(auVar110,0xaa);
                  auVar110 = vblendvps_avx(auVar99,auVar87,auVar112);
                  auVar87 = vblendvps_avx(auVar87,auVar99,auVar112);
                  auVar99 = vpcmpgtd_avx(auVar111,auVar110);
                  auVar112 = vpshufd_avx(auVar99,0xaa);
                  auVar99 = vblendvps_avx(auVar111,auVar110,auVar112);
                  auVar110 = vblendvps_avx(auVar110,auVar111,auVar112);
                  auVar111 = vpcmpgtd_avx(auVar110,auVar87);
                  auVar112 = vpshufd_avx(auVar111,0xaa);
                  auVar111 = vblendvps_avx(auVar110,auVar87,auVar112);
                  auVar87 = vblendvps_avx(auVar87,auVar110,auVar112);
                  *pauVar83 = auVar87;
                  pauVar83[1] = auVar111;
                  uVar85 = auVar99._0_8_;
                  pauVar83 = pauVar83 + 2;
                }
                else {
                  lVar75 = 0;
                  if (uVar81 != 0) {
                    for (; (uVar81 >> lVar75 & 1) == 0; lVar75 = lVar75 + 1) {
                    }
                  }
                  auVar142._8_8_ = 0;
                  auVar142._0_8_ = *(ulong *)(uVar84 + lVar75 * 8);
                  auVar125 = vpunpcklqdq_avx(auVar142,ZEXT416(*(uint *)(local_1420 + lVar75 * 4)));
                  auVar112 = vpshufd_avx(auVar110,0xaa);
                  auVar110 = vblendvps_avx(auVar99,auVar87,auVar112);
                  auVar87 = vblendvps_avx(auVar87,auVar99,auVar112);
                  auVar99 = vpcmpgtd_avx(auVar125,auVar111);
                  auVar112 = vpshufd_avx(auVar99,0xaa);
                  auVar99 = vblendvps_avx(auVar125,auVar111,auVar112);
                  auVar111 = vblendvps_avx(auVar111,auVar125,auVar112);
                  auVar112 = vpcmpgtd_avx(auVar111,auVar87);
                  auVar125 = vpshufd_avx(auVar112,0xaa);
                  auVar112 = vblendvps_avx(auVar111,auVar87,auVar125);
                  auVar87 = vblendvps_avx(auVar87,auVar111,auVar125);
                  auVar111 = vpcmpgtd_avx(auVar99,auVar110);
                  auVar125 = vpshufd_avx(auVar111,0xaa);
                  auVar111 = vblendvps_avx(auVar99,auVar110,auVar125);
                  auVar99 = vblendvps_avx(auVar110,auVar99,auVar125);
                  auVar110 = vpcmpgtd_avx(auVar112,auVar99);
                  auVar125 = vpshufd_avx(auVar110,0xaa);
                  auVar110 = vblendvps_avx(auVar112,auVar99,auVar125);
                  auVar99 = vblendvps_avx(auVar99,auVar112,auVar125);
                  *pauVar83 = auVar87;
                  pauVar83[1] = auVar99;
                  pauVar83[2] = auVar110;
                  auVar150 = ZEXT1664(local_14e0);
                  uVar85 = auVar111._0_8_;
                  pauVar83 = pauVar83 + 3;
                }
              }
            }
          }
        }
        else {
          iVar72 = 6;
        }
      } while (iVar72 == 0);
    } while (iVar72 != 6);
    uVar84 = (ulong)((uint)uVar85 & 0xf);
    if (uVar84 != 8) {
      uVar85 = uVar85 & 0xfffffffffffffff0;
      lVar75 = 0;
      do {
        lVar74 = lVar75 * 0x60;
        pSVar5 = context->scene;
        ppfVar6 = (pSVar5->vertices).items;
        pfVar7 = ppfVar6[*(uint *)(uVar85 + 0x40 + lVar74)];
        pfVar8 = ppfVar6[*(uint *)(uVar85 + 0x44 + lVar74)];
        pfVar9 = ppfVar6[*(uint *)(uVar85 + 0x48 + lVar74)];
        pfVar10 = ppfVar6[*(uint *)(uVar85 + 0x4c + lVar74)];
        auVar110 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + lVar74)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 8 + lVar74)));
        auVar87 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + lVar74)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 8 + lVar74)));
        auVar111 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 4 + lVar74)),
                                 *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar85 + 0xc + lVar74)))
        ;
        auVar99 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 4 + lVar74)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar85 + 0xc + lVar74)));
        auVar125 = vunpcklps_avx(auVar87,auVar99);
        auVar126 = vunpcklps_avx(auVar110,auVar111);
        auVar87 = vunpckhps_avx(auVar110,auVar111);
        auVar111 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x10 + lVar74)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0x18 + lVar74)))
        ;
        auVar99 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x10 + lVar74)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0x18 + lVar74)));
        auVar112 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x14 + lVar74)),
                                 *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar85 + 0x1c + lVar74))
                                );
        auVar110 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x14 + lVar74)),
                                 *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar85 + 0x1c + lVar74))
                                );
        auVar113 = vunpcklps_avx(auVar99,auVar110);
        auVar127 = vunpcklps_avx(auVar111,auVar112);
        auVar99 = vunpckhps_avx(auVar111,auVar112);
        auVar112 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x20 + lVar74)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0x28 + lVar74)))
        ;
        auVar110 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x20 + lVar74)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0x28 + lVar74)))
        ;
        auVar142 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x24 + lVar74)),
                                 *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar85 + 0x2c + lVar74))
                                );
        auVar111 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x24 + lVar74)),
                                 *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar85 + 0x2c + lVar74))
                                );
        auVar39 = vunpcklps_avx(auVar110,auVar111);
        auVar40 = vunpcklps_avx(auVar112,auVar142);
        auVar110 = vunpckhps_avx(auVar112,auVar142);
        auVar142 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x30 + lVar74)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0x38 + lVar74)))
        ;
        auVar111 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x30 + lVar74)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0x38 + lVar74)))
        ;
        auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x34 + lVar74)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar85 + 0x3c + lVar74)))
        ;
        auVar112 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x34 + lVar74)),
                                 *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar85 + 0x3c + lVar74))
                                );
        auVar112 = vunpcklps_avx(auVar111,auVar112);
        auVar42 = vunpcklps_avx(auVar142,auVar41);
        lVar1 = uVar85 + 0x40 + lVar74;
        local_10e0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_10d8 = *(undefined8 *)(lVar1 + 0x18);
        auVar111 = vunpckhps_avx(auVar142,auVar41);
        uStack_10d0 = local_10e0;
        uStack_10c8 = uStack_10d8;
        lVar74 = uVar85 + 0x50 + lVar74;
        local_1440 = *(undefined8 *)(lVar74 + 0x10);
        uStack_1438 = *(undefined8 *)(lVar74 + 0x18);
        uStack_1430 = local_1440;
        uStack_1428 = uStack_1438;
        auVar143._16_16_ = auVar40;
        auVar143._0_16_ = auVar126;
        auVar157._16_16_ = auVar110;
        auVar157._0_16_ = auVar87;
        auVar100._16_16_ = auVar39;
        auVar100._0_16_ = auVar125;
        auVar147._16_16_ = auVar127;
        auVar147._0_16_ = auVar127;
        auVar176._16_16_ = auVar99;
        auVar176._0_16_ = auVar99;
        auVar190._16_16_ = auVar113;
        auVar190._0_16_ = auVar113;
        auVar186._16_16_ = auVar42;
        auVar186._0_16_ = auVar42;
        auVar161._16_16_ = auVar111;
        auVar161._0_16_ = auVar111;
        auVar128._16_16_ = auVar112;
        auVar128._0_16_ = auVar112;
        uVar86 = *(undefined4 *)(ray + k * 4);
        auVar200._4_4_ = uVar86;
        auVar200._0_4_ = uVar86;
        auVar200._8_4_ = uVar86;
        auVar200._12_4_ = uVar86;
        auVar200._16_4_ = uVar86;
        auVar200._20_4_ = uVar86;
        auVar200._24_4_ = uVar86;
        auVar200._28_4_ = uVar86;
        uVar86 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar216._4_4_ = uVar86;
        auVar216._0_4_ = uVar86;
        auVar216._8_4_ = uVar86;
        auVar216._12_4_ = uVar86;
        auVar216._16_4_ = uVar86;
        auVar216._20_4_ = uVar86;
        auVar216._24_4_ = uVar86;
        auVar216._28_4_ = uVar86;
        uVar86 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar219._4_4_ = uVar86;
        auVar219._0_4_ = uVar86;
        auVar219._8_4_ = uVar86;
        auVar219._12_4_ = uVar86;
        auVar219._16_4_ = uVar86;
        auVar219._20_4_ = uVar86;
        auVar219._24_4_ = uVar86;
        auVar219._28_4_ = uVar86;
        local_1120 = vsubps_avx(auVar143,auVar200);
        local_1140 = vsubps_avx(auVar157,auVar216);
        local_1160 = vsubps_avx(auVar100,auVar219);
        auVar88 = vsubps_avx(auVar147,auVar200);
        auVar114 = vsubps_avx(auVar176,auVar216);
        auVar32 = vsubps_avx(auVar190,auVar219);
        auVar33 = vsubps_avx(auVar186,auVar200);
        auVar34 = vsubps_avx(auVar161,auVar216);
        auVar35 = vsubps_avx(auVar128,auVar219);
        local_1180 = vsubps_avx(auVar33,local_1120);
        local_11a0 = vsubps_avx(auVar34,local_1140);
        local_11c0 = vsubps_avx(auVar35,local_1160);
        fVar2 = local_1140._0_4_;
        fVar97 = auVar34._0_4_ + fVar2;
        fVar15 = local_1140._4_4_;
        fVar104 = auVar34._4_4_ + fVar15;
        fVar120 = local_1140._8_4_;
        fVar105 = auVar34._8_4_ + fVar120;
        fVar123 = local_1140._12_4_;
        fVar106 = auVar34._12_4_ + fVar123;
        fVar18 = local_1140._16_4_;
        fVar107 = auVar34._16_4_ + fVar18;
        fVar21 = local_1140._20_4_;
        fVar108 = auVar34._20_4_ + fVar21;
        fVar24 = local_1140._24_4_;
        fVar109 = auVar34._24_4_ + fVar24;
        fVar98 = local_1140._28_4_;
        fVar13 = local_1160._0_4_;
        fVar159 = auVar35._0_4_ + fVar13;
        fVar16 = local_1160._4_4_;
        fVar163 = auVar35._4_4_ + fVar16;
        fVar121 = local_1160._8_4_;
        fVar165 = auVar35._8_4_ + fVar121;
        fVar124 = local_1160._12_4_;
        fVar167 = auVar35._12_4_ + fVar124;
        fVar19 = local_1160._16_4_;
        fVar169 = auVar35._16_4_ + fVar19;
        fVar22 = local_1160._20_4_;
        fVar171 = auVar35._20_4_ + fVar22;
        fVar25 = local_1160._24_4_;
        fVar173 = auVar35._24_4_ + fVar25;
        fVar27 = local_11c0._0_4_;
        fVar29 = local_11c0._4_4_;
        auVar36._4_4_ = fVar104 * fVar29;
        auVar36._0_4_ = fVar97 * fVar27;
        fVar31 = local_11c0._8_4_;
        auVar36._8_4_ = fVar105 * fVar31;
        fVar94 = local_11c0._12_4_;
        auVar36._12_4_ = fVar106 * fVar94;
        fVar95 = local_11c0._16_4_;
        auVar36._16_4_ = fVar107 * fVar95;
        fVar96 = local_11c0._20_4_;
        auVar36._20_4_ = fVar108 * fVar96;
        fVar145 = local_11c0._24_4_;
        auVar36._24_4_ = fVar109 * fVar145;
        auVar36._28_4_ = auVar99._12_4_;
        fVar198 = local_11a0._0_4_;
        fVar202 = local_11a0._4_4_;
        auVar37._4_4_ = fVar202 * fVar163;
        auVar37._0_4_ = fVar198 * fVar159;
        fVar204 = local_11a0._8_4_;
        auVar37._8_4_ = fVar204 * fVar165;
        fVar206 = local_11a0._12_4_;
        auVar37._12_4_ = fVar206 * fVar167;
        fVar208 = local_11a0._16_4_;
        auVar37._16_4_ = fVar208 * fVar169;
        fVar210 = local_11a0._20_4_;
        auVar37._20_4_ = fVar210 * fVar171;
        fVar212 = local_11a0._24_4_;
        auVar37._24_4_ = fVar212 * fVar173;
        auVar37._28_4_ = auVar42._12_4_;
        auVar36 = vsubps_avx(auVar37,auVar36);
        fVar14 = local_1120._0_4_;
        fVar175 = auVar33._0_4_ + fVar14;
        fVar119 = local_1120._4_4_;
        fVar180 = auVar33._4_4_ + fVar119;
        fVar122 = local_1120._8_4_;
        fVar181 = auVar33._8_4_ + fVar122;
        fVar17 = local_1120._12_4_;
        fVar182 = auVar33._12_4_ + fVar17;
        fVar20 = local_1120._16_4_;
        fVar183 = auVar33._16_4_ + fVar20;
        fVar23 = local_1120._20_4_;
        fVar184 = auVar33._20_4_ + fVar23;
        fVar26 = local_1120._24_4_;
        fVar185 = auVar33._24_4_ + fVar26;
        fVar28 = local_1180._0_4_;
        fVar30 = local_1180._4_4_;
        auVar38._4_4_ = fVar163 * fVar30;
        auVar38._0_4_ = fVar159 * fVar28;
        fVar159 = local_1180._8_4_;
        auVar38._8_4_ = fVar165 * fVar159;
        fVar163 = local_1180._12_4_;
        auVar38._12_4_ = fVar167 * fVar163;
        fVar165 = local_1180._16_4_;
        auVar38._16_4_ = fVar169 * fVar165;
        fVar167 = local_1180._20_4_;
        auVar38._20_4_ = fVar171 * fVar167;
        fVar169 = local_1180._24_4_;
        auVar38._24_4_ = fVar173 * fVar169;
        auVar38._28_4_ = auVar35._28_4_ + local_1160._28_4_;
        auVar43._4_4_ = fVar180 * fVar29;
        auVar43._0_4_ = fVar175 * fVar27;
        auVar43._8_4_ = fVar181 * fVar31;
        auVar43._12_4_ = fVar182 * fVar94;
        auVar43._16_4_ = fVar183 * fVar95;
        auVar43._20_4_ = fVar184 * fVar96;
        auVar43._24_4_ = fVar185 * fVar145;
        auVar43._28_4_ = auVar42._12_4_;
        auVar37 = vsubps_avx(auVar43,auVar38);
        auVar43 = local_11a0;
        auVar44._4_4_ = fVar180 * fVar202;
        auVar44._0_4_ = fVar175 * fVar198;
        auVar44._8_4_ = fVar181 * fVar204;
        auVar44._12_4_ = fVar182 * fVar206;
        auVar44._16_4_ = fVar183 * fVar208;
        auVar44._20_4_ = fVar184 * fVar210;
        auVar44._24_4_ = fVar185 * fVar212;
        auVar44._28_4_ = auVar33._28_4_ + local_1120._28_4_;
        auVar45._4_4_ = fVar30 * fVar104;
        auVar45._0_4_ = fVar28 * fVar97;
        auVar45._8_4_ = fVar159 * fVar105;
        auVar45._12_4_ = fVar163 * fVar106;
        auVar45._16_4_ = fVar165 * fVar107;
        auVar45._20_4_ = fVar167 * fVar108;
        auVar45._24_4_ = fVar169 * fVar109;
        auVar45._28_4_ = auVar34._28_4_ + fVar98;
        auVar38 = vsubps_avx(auVar45,auVar44);
        fVar97 = *(float *)(ray + k * 4 + 0xa0);
        fVar104 = *(float *)(ray + k * 4 + 0xc0);
        local_1100 = *(float *)(ray + k * 4 + 0x80);
        fStack_10fc = local_1100;
        fStack_10f8 = local_1100;
        fStack_10f4 = local_1100;
        fStack_10f0 = local_1100;
        fStack_10ec = local_1100;
        fStack_10e8 = local_1100;
        fStack_10e4 = local_1100;
        auVar187._0_4_ =
             auVar36._0_4_ * local_1100 + fVar97 * auVar37._0_4_ + auVar38._0_4_ * fVar104;
        auVar187._4_4_ =
             auVar36._4_4_ * local_1100 + fVar97 * auVar37._4_4_ + auVar38._4_4_ * fVar104;
        auVar187._8_4_ =
             auVar36._8_4_ * local_1100 + fVar97 * auVar37._8_4_ + auVar38._8_4_ * fVar104;
        auVar187._12_4_ =
             auVar36._12_4_ * local_1100 + fVar97 * auVar37._12_4_ + auVar38._12_4_ * fVar104;
        auVar187._16_4_ =
             auVar36._16_4_ * local_1100 + fVar97 * auVar37._16_4_ + auVar38._16_4_ * fVar104;
        auVar187._20_4_ =
             auVar36._20_4_ * local_1100 + fVar97 * auVar37._20_4_ + auVar38._20_4_ * fVar104;
        auVar187._24_4_ =
             auVar36._24_4_ * local_1100 + fVar97 * auVar37._24_4_ + auVar38._24_4_ * fVar104;
        auVar187._28_4_ = auVar37._28_4_ + auVar37._28_4_ + auVar38._28_4_;
        local_11e0 = vsubps_avx(local_1140,auVar114);
        auVar37 = vsubps_avx(local_1160,auVar32);
        fVar106 = fVar2 + auVar114._0_4_;
        fVar107 = fVar15 + auVar114._4_4_;
        fVar108 = fVar120 + auVar114._8_4_;
        fVar109 = fVar123 + auVar114._12_4_;
        fVar171 = fVar18 + auVar114._16_4_;
        fVar173 = fVar21 + auVar114._20_4_;
        fVar175 = fVar24 + auVar114._24_4_;
        fVar105 = auVar114._28_4_;
        fVar180 = auVar32._0_4_ + fVar13;
        fVar181 = auVar32._4_4_ + fVar16;
        fVar182 = auVar32._8_4_ + fVar121;
        fVar183 = auVar32._12_4_ + fVar124;
        fVar184 = auVar32._16_4_ + fVar19;
        fVar185 = auVar32._20_4_ + fVar22;
        fVar135 = auVar32._24_4_ + fVar25;
        fVar160 = auVar37._0_4_;
        fVar164 = auVar37._4_4_;
        auVar46._4_4_ = fVar164 * fVar107;
        auVar46._0_4_ = fVar160 * fVar106;
        fVar166 = auVar37._8_4_;
        auVar46._8_4_ = fVar166 * fVar108;
        fVar168 = auVar37._12_4_;
        auVar46._12_4_ = fVar168 * fVar109;
        fVar170 = auVar37._16_4_;
        auVar46._16_4_ = fVar170 * fVar171;
        fVar172 = auVar37._20_4_;
        auVar46._20_4_ = fVar172 * fVar173;
        fVar174 = auVar37._24_4_;
        auVar46._24_4_ = fVar174 * fVar175;
        auVar46._28_4_ = auVar36._28_4_;
        fVar189 = local_11e0._0_4_;
        fVar192 = local_11e0._4_4_;
        auVar47._4_4_ = fVar192 * fVar181;
        auVar47._0_4_ = fVar189 * fVar180;
        fVar193 = local_11e0._8_4_;
        auVar47._8_4_ = fVar193 * fVar182;
        fVar194 = local_11e0._12_4_;
        auVar47._12_4_ = fVar194 * fVar183;
        fVar195 = local_11e0._16_4_;
        auVar47._16_4_ = fVar195 * fVar184;
        fVar196 = local_11e0._20_4_;
        auVar47._20_4_ = fVar196 * fVar185;
        fVar197 = local_11e0._24_4_;
        auVar47._24_4_ = fVar197 * fVar135;
        auVar47._28_4_ = fVar98;
        auVar36 = vsubps_avx(auVar47,auVar46);
        auVar37 = vsubps_avx(local_1120,auVar88);
        fVar218 = auVar37._0_4_;
        fVar221 = auVar37._4_4_;
        auVar48._4_4_ = fVar221 * fVar181;
        auVar48._0_4_ = fVar218 * fVar180;
        fVar222 = auVar37._8_4_;
        auVar48._8_4_ = fVar222 * fVar182;
        fVar223 = auVar37._12_4_;
        auVar48._12_4_ = fVar223 * fVar183;
        fVar224 = auVar37._16_4_;
        auVar48._16_4_ = fVar224 * fVar184;
        fVar225 = auVar37._20_4_;
        auVar48._20_4_ = fVar225 * fVar185;
        fVar226 = auVar37._24_4_;
        auVar48._24_4_ = fVar226 * fVar135;
        auVar48._28_4_ = auVar32._28_4_ + local_1160._28_4_;
        fVar180 = auVar88._0_4_ + fVar14;
        fVar181 = auVar88._4_4_ + fVar119;
        fVar182 = auVar88._8_4_ + fVar122;
        fVar183 = auVar88._12_4_ + fVar17;
        fVar184 = auVar88._16_4_ + fVar20;
        fVar185 = auVar88._20_4_ + fVar23;
        fVar135 = auVar88._24_4_ + fVar26;
        fVar214 = auVar88._28_4_;
        auVar49._4_4_ = fVar181 * fVar164;
        auVar49._0_4_ = fVar180 * fVar160;
        auVar49._8_4_ = fVar182 * fVar166;
        auVar49._12_4_ = fVar183 * fVar168;
        auVar49._16_4_ = fVar184 * fVar170;
        auVar49._20_4_ = fVar185 * fVar172;
        auVar49._24_4_ = fVar135 * fVar174;
        auVar49._28_4_ = fVar214;
        auVar37 = vsubps_avx(auVar49,auVar48);
        auVar50._4_4_ = fVar181 * fVar192;
        auVar50._0_4_ = fVar180 * fVar189;
        auVar50._8_4_ = fVar182 * fVar193;
        auVar50._12_4_ = fVar183 * fVar194;
        auVar50._16_4_ = fVar184 * fVar195;
        auVar50._20_4_ = fVar185 * fVar196;
        auVar50._24_4_ = fVar135 * fVar197;
        auVar50._28_4_ = fVar214 + local_1120._28_4_;
        auVar51._4_4_ = fVar221 * fVar107;
        auVar51._0_4_ = fVar218 * fVar106;
        auVar51._8_4_ = fVar222 * fVar108;
        auVar51._12_4_ = fVar223 * fVar109;
        auVar51._16_4_ = fVar224 * fVar171;
        auVar51._20_4_ = fVar225 * fVar173;
        auVar51._24_4_ = fVar226 * fVar175;
        auVar51._28_4_ = fVar98 + fVar105;
        auVar38 = vsubps_avx(auVar51,auVar50);
        local_1520._0_4_ =
             local_1100 * auVar36._0_4_ + auVar38._0_4_ * fVar104 + fVar97 * auVar37._0_4_;
        local_1520._4_4_ =
             local_1100 * auVar36._4_4_ + auVar38._4_4_ * fVar104 + fVar97 * auVar37._4_4_;
        local_1520._8_4_ =
             local_1100 * auVar36._8_4_ + auVar38._8_4_ * fVar104 + fVar97 * auVar37._8_4_;
        local_1520._12_4_ =
             local_1100 * auVar36._12_4_ + auVar38._12_4_ * fVar104 + fVar97 * auVar37._12_4_;
        local_1520._16_4_ =
             local_1100 * auVar36._16_4_ + auVar38._16_4_ * fVar104 + fVar97 * auVar37._16_4_;
        local_1520._20_4_ =
             local_1100 * auVar36._20_4_ + auVar38._20_4_ * fVar104 + fVar97 * auVar37._20_4_;
        local_1520._24_4_ =
             local_1100 * auVar36._24_4_ + auVar38._24_4_ * fVar104 + fVar97 * auVar37._24_4_;
        local_1520._28_4_ = auVar37._28_4_ + auVar38._28_4_ + auVar37._28_4_;
        auVar36 = vsubps_avx(auVar88,auVar33);
        fVar173 = auVar88._0_4_ + auVar33._0_4_;
        fVar175 = auVar88._4_4_ + auVar33._4_4_;
        fVar180 = auVar88._8_4_ + auVar33._8_4_;
        fVar181 = auVar88._12_4_ + auVar33._12_4_;
        fVar182 = auVar88._16_4_ + auVar33._16_4_;
        fVar183 = auVar88._20_4_ + auVar33._20_4_;
        fVar184 = auVar88._24_4_ + auVar33._24_4_;
        auVar88 = vsubps_avx(auVar114,auVar34);
        fVar185 = auVar34._0_4_ + auVar114._0_4_;
        fVar135 = auVar34._4_4_ + auVar114._4_4_;
        fVar131 = auVar34._8_4_ + auVar114._8_4_;
        fVar132 = auVar34._12_4_ + auVar114._12_4_;
        fVar133 = auVar34._16_4_ + auVar114._16_4_;
        fVar134 = auVar34._20_4_ + auVar114._20_4_;
        fVar136 = auVar34._24_4_ + auVar114._24_4_;
        fVar137 = auVar34._28_4_ + fVar105;
        auVar114 = vsubps_avx(auVar32,auVar35);
        fVar106 = auVar32._0_4_ + auVar35._0_4_;
        fVar107 = auVar32._4_4_ + auVar35._4_4_;
        fVar108 = auVar32._8_4_ + auVar35._8_4_;
        fVar109 = auVar32._12_4_ + auVar35._12_4_;
        fVar171 = auVar32._16_4_ + auVar35._16_4_;
        fVar140 = auVar32._20_4_ + auVar35._20_4_;
        fVar141 = auVar32._24_4_ + auVar35._24_4_;
        fVar199 = auVar114._0_4_;
        fVar203 = auVar114._4_4_;
        auVar34._4_4_ = fVar203 * fVar135;
        auVar34._0_4_ = fVar199 * fVar185;
        fVar205 = auVar114._8_4_;
        auVar34._8_4_ = fVar205 * fVar131;
        fVar207 = auVar114._12_4_;
        auVar34._12_4_ = fVar207 * fVar132;
        fVar209 = auVar114._16_4_;
        auVar34._16_4_ = fVar209 * fVar133;
        fVar211 = auVar114._20_4_;
        auVar34._20_4_ = fVar211 * fVar134;
        fVar213 = auVar114._24_4_;
        auVar34._24_4_ = fVar213 * fVar136;
        auVar34._28_4_ = fVar105;
        fVar146 = auVar88._0_4_;
        fVar151 = auVar88._4_4_;
        auVar52._4_4_ = fVar151 * fVar107;
        auVar52._0_4_ = fVar146 * fVar106;
        fVar152 = auVar88._8_4_;
        auVar52._8_4_ = fVar152 * fVar108;
        fVar153 = auVar88._12_4_;
        auVar52._12_4_ = fVar153 * fVar109;
        fVar154 = auVar88._16_4_;
        auVar52._16_4_ = fVar154 * fVar171;
        fVar155 = auVar88._20_4_;
        auVar52._20_4_ = fVar155 * fVar140;
        fVar156 = auVar88._24_4_;
        uVar86 = auVar88._28_4_;
        auVar52._24_4_ = fVar156 * fVar141;
        auVar52._28_4_ = uVar86;
        auVar88 = vsubps_avx(auVar52,auVar34);
        fVar98 = auVar36._0_4_;
        fVar105 = auVar36._4_4_;
        auVar53._4_4_ = fVar105 * fVar107;
        auVar53._0_4_ = fVar98 * fVar106;
        fVar106 = auVar36._8_4_;
        auVar53._8_4_ = fVar106 * fVar108;
        fVar107 = auVar36._12_4_;
        auVar53._12_4_ = fVar107 * fVar109;
        fVar108 = auVar36._16_4_;
        auVar53._16_4_ = fVar108 * fVar171;
        fVar109 = auVar36._20_4_;
        auVar53._20_4_ = fVar109 * fVar140;
        fVar171 = auVar36._24_4_;
        auVar53._24_4_ = fVar171 * fVar141;
        auVar53._28_4_ = auVar32._28_4_ + auVar35._28_4_;
        auVar32._4_4_ = fVar203 * fVar175;
        auVar32._0_4_ = fVar199 * fVar173;
        auVar32._8_4_ = fVar205 * fVar180;
        auVar32._12_4_ = fVar207 * fVar181;
        auVar32._16_4_ = fVar209 * fVar182;
        auVar32._20_4_ = fVar211 * fVar183;
        auVar32._24_4_ = fVar213 * fVar184;
        auVar32._28_4_ = uVar86;
        auVar114 = vsubps_avx(auVar32,auVar53);
        auVar35._4_4_ = fVar175 * fVar151;
        auVar35._0_4_ = fVar173 * fVar146;
        auVar35._8_4_ = fVar180 * fVar152;
        auVar35._12_4_ = fVar181 * fVar153;
        auVar35._16_4_ = fVar182 * fVar154;
        auVar35._20_4_ = fVar183 * fVar155;
        auVar35._24_4_ = fVar184 * fVar156;
        auVar35._28_4_ = fVar214 + auVar33._28_4_;
        auVar33._4_4_ = fVar105 * fVar135;
        auVar33._0_4_ = fVar98 * fVar185;
        auVar33._8_4_ = fVar106 * fVar131;
        auVar33._12_4_ = fVar107 * fVar132;
        auVar33._16_4_ = fVar108 * fVar133;
        auVar33._20_4_ = fVar109 * fVar134;
        auVar33._24_4_ = fVar171 * fVar136;
        auVar33._28_4_ = fVar137;
        auVar32 = vsubps_avx(auVar33,auVar35);
        auVar115._0_4_ =
             local_1100 * auVar88._0_4_ + auVar32._0_4_ * fVar104 + fVar97 * auVar114._0_4_;
        auVar115._4_4_ =
             local_1100 * auVar88._4_4_ + auVar32._4_4_ * fVar104 + fVar97 * auVar114._4_4_;
        auVar115._8_4_ =
             local_1100 * auVar88._8_4_ + auVar32._8_4_ * fVar104 + fVar97 * auVar114._8_4_;
        auVar115._12_4_ =
             local_1100 * auVar88._12_4_ + auVar32._12_4_ * fVar104 + fVar97 * auVar114._12_4_;
        auVar115._16_4_ =
             local_1100 * auVar88._16_4_ + auVar32._16_4_ * fVar104 + fVar97 * auVar114._16_4_;
        auVar115._20_4_ =
             local_1100 * auVar88._20_4_ + auVar32._20_4_ * fVar104 + fVar97 * auVar114._20_4_;
        auVar115._24_4_ =
             local_1100 * auVar88._24_4_ + auVar32._24_4_ * fVar104 + fVar97 * auVar114._24_4_;
        auVar115._28_4_ = fVar137 + auVar32._28_4_ + fVar137;
        local_1220._0_4_ = auVar115._0_4_ + auVar187._0_4_ + local_1520._0_4_;
        local_1220._4_4_ = auVar115._4_4_ + auVar187._4_4_ + local_1520._4_4_;
        local_1220._8_4_ = auVar115._8_4_ + auVar187._8_4_ + local_1520._8_4_;
        local_1220._12_4_ = auVar115._12_4_ + auVar187._12_4_ + local_1520._12_4_;
        local_1220._16_4_ = auVar115._16_4_ + auVar187._16_4_ + local_1520._16_4_;
        local_1220._20_4_ = auVar115._20_4_ + auVar187._20_4_ + local_1520._20_4_;
        local_1220._24_4_ = auVar115._24_4_ + auVar187._24_4_ + local_1520._24_4_;
        local_1220._28_4_ = auVar115._28_4_ + auVar187._28_4_ + local_1520._28_4_;
        auVar88 = vminps_avx(auVar187,local_1520);
        auVar88 = vminps_avx(auVar88,auVar115);
        auVar138._8_4_ = 0x7fffffff;
        auVar138._0_8_ = 0x7fffffff7fffffff;
        auVar138._12_4_ = 0x7fffffff;
        auVar138._16_4_ = 0x7fffffff;
        auVar138._20_4_ = 0x7fffffff;
        auVar138._24_4_ = 0x7fffffff;
        auVar138._28_4_ = 0x7fffffff;
        local_1200 = vandps_avx(local_1220,auVar138);
        fVar173 = local_1200._0_4_ * 1.1920929e-07;
        fVar175 = local_1200._4_4_ * 1.1920929e-07;
        auVar54._4_4_ = fVar175;
        auVar54._0_4_ = fVar173;
        fVar180 = local_1200._8_4_ * 1.1920929e-07;
        auVar54._8_4_ = fVar180;
        fVar181 = local_1200._12_4_ * 1.1920929e-07;
        auVar54._12_4_ = fVar181;
        fVar182 = local_1200._16_4_ * 1.1920929e-07;
        auVar54._16_4_ = fVar182;
        fVar183 = local_1200._20_4_ * 1.1920929e-07;
        auVar54._20_4_ = fVar183;
        fVar184 = local_1200._24_4_ * 1.1920929e-07;
        auVar54._24_4_ = fVar184;
        auVar54._28_4_ = 0x34000000;
        auVar144._0_8_ = CONCAT44(fVar175,fVar173) ^ 0x8000000080000000;
        auVar144._8_4_ = -fVar180;
        auVar144._12_4_ = -fVar181;
        auVar144._16_4_ = -fVar182;
        auVar144._20_4_ = -fVar183;
        auVar144._24_4_ = -fVar184;
        auVar144._28_4_ = 0xb4000000;
        auVar88 = vcmpps_avx(auVar88,auVar144,5);
        auVar32 = vmaxps_avx(auVar187,local_1520);
        auVar114 = vmaxps_avx(auVar32,auVar115);
        auVar114 = vcmpps_avx(auVar114,auVar54,2);
        auVar114 = vorps_avx(auVar88,auVar114);
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0x7f,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0xbf,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar114[0x1f] < '\0') {
          auVar55._4_4_ = fVar192 * fVar29;
          auVar55._0_4_ = fVar189 * fVar27;
          auVar55._8_4_ = fVar193 * fVar31;
          auVar55._12_4_ = fVar194 * fVar94;
          auVar55._16_4_ = fVar195 * fVar95;
          auVar55._20_4_ = fVar196 * fVar96;
          auVar55._24_4_ = fVar197 * fVar145;
          auVar55._28_4_ = auVar88._28_4_;
          auVar56._4_4_ = fVar202 * fVar164;
          auVar56._0_4_ = fVar198 * fVar160;
          auVar56._8_4_ = fVar204 * fVar166;
          auVar56._12_4_ = fVar206 * fVar168;
          auVar56._16_4_ = fVar208 * fVar170;
          auVar56._20_4_ = fVar210 * fVar172;
          auVar56._24_4_ = fVar212 * fVar174;
          auVar56._28_4_ = 0x34000000;
          auVar33 = vsubps_avx(auVar56,auVar55);
          auVar57._4_4_ = fVar164 * fVar151;
          auVar57._0_4_ = fVar160 * fVar146;
          auVar57._8_4_ = fVar166 * fVar152;
          auVar57._12_4_ = fVar168 * fVar153;
          auVar57._16_4_ = fVar170 * fVar154;
          auVar57._20_4_ = fVar172 * fVar155;
          auVar57._24_4_ = fVar174 * fVar156;
          auVar57._28_4_ = auVar32._28_4_;
          auVar58._4_4_ = fVar192 * fVar203;
          auVar58._0_4_ = fVar189 * fVar199;
          auVar58._8_4_ = fVar193 * fVar205;
          auVar58._12_4_ = fVar194 * fVar207;
          auVar58._16_4_ = fVar195 * fVar209;
          auVar58._20_4_ = fVar196 * fVar211;
          auVar58._24_4_ = fVar197 * fVar213;
          auVar58._28_4_ = uVar86;
          auVar34 = vsubps_avx(auVar58,auVar57);
          auVar177._8_4_ = 0x7fffffff;
          auVar177._0_8_ = 0x7fffffff7fffffff;
          auVar177._12_4_ = 0x7fffffff;
          auVar177._16_4_ = 0x7fffffff;
          auVar177._20_4_ = 0x7fffffff;
          auVar177._24_4_ = 0x7fffffff;
          auVar177._28_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar177,auVar55);
          auVar32 = vandps_avx(auVar177,auVar57);
          auVar88 = vcmpps_avx(auVar88,auVar32,1);
          local_13c0 = vblendvps_avx(auVar34,auVar33,auVar88);
          auVar59._4_4_ = fVar221 * fVar203;
          auVar59._0_4_ = fVar218 * fVar199;
          auVar59._8_4_ = fVar222 * fVar205;
          auVar59._12_4_ = fVar223 * fVar207;
          auVar59._16_4_ = fVar224 * fVar209;
          auVar59._20_4_ = fVar225 * fVar211;
          auVar59._24_4_ = fVar226 * fVar213;
          auVar59._28_4_ = auVar88._28_4_;
          auVar60._4_4_ = fVar221 * fVar29;
          auVar60._0_4_ = fVar218 * fVar27;
          auVar60._8_4_ = fVar222 * fVar31;
          auVar60._12_4_ = fVar223 * fVar94;
          auVar60._16_4_ = fVar224 * fVar95;
          auVar60._20_4_ = fVar225 * fVar96;
          auVar60._24_4_ = fVar226 * fVar145;
          auVar60._28_4_ = auVar33._28_4_;
          auVar61._4_4_ = fVar164 * fVar30;
          auVar61._0_4_ = fVar160 * fVar28;
          auVar61._8_4_ = fVar166 * fVar159;
          auVar61._12_4_ = fVar168 * fVar163;
          auVar61._16_4_ = fVar170 * fVar165;
          auVar61._20_4_ = fVar172 * fVar167;
          auVar61._24_4_ = fVar174 * fVar169;
          auVar61._28_4_ = auVar32._28_4_;
          auVar33 = vsubps_avx(auVar60,auVar61);
          auVar62._4_4_ = fVar164 * fVar105;
          auVar62._0_4_ = fVar160 * fVar98;
          auVar62._8_4_ = fVar166 * fVar106;
          auVar62._12_4_ = fVar168 * fVar107;
          auVar62._16_4_ = fVar170 * fVar108;
          auVar62._20_4_ = fVar172 * fVar109;
          auVar62._24_4_ = fVar174 * fVar171;
          auVar62._28_4_ = auVar34._28_4_;
          auVar34 = vsubps_avx(auVar62,auVar59);
          auVar88 = vandps_avx(auVar177,auVar61);
          auVar32 = vandps_avx(auVar177,auVar59);
          auVar88 = vcmpps_avx(auVar88,auVar32,1);
          local_13a0 = vblendvps_avx(auVar34,auVar33,auVar88);
          auVar63._4_4_ = fVar192 * fVar105;
          auVar63._0_4_ = fVar189 * fVar98;
          auVar63._8_4_ = fVar193 * fVar106;
          auVar63._12_4_ = fVar194 * fVar107;
          auVar63._16_4_ = fVar195 * fVar108;
          auVar63._20_4_ = fVar196 * fVar109;
          auVar63._24_4_ = fVar197 * fVar171;
          auVar63._28_4_ = auVar36._28_4_;
          auVar64._4_4_ = fVar192 * fVar30;
          auVar64._0_4_ = fVar189 * fVar28;
          auVar64._8_4_ = fVar193 * fVar159;
          auVar64._12_4_ = fVar194 * fVar163;
          auVar64._16_4_ = fVar195 * fVar165;
          auVar64._20_4_ = fVar196 * fVar167;
          auVar64._24_4_ = fVar197 * fVar169;
          auVar64._28_4_ = auVar88._28_4_;
          auVar65._4_4_ = fVar221 * fVar202;
          auVar65._0_4_ = fVar218 * fVar198;
          auVar65._8_4_ = fVar222 * fVar204;
          auVar65._12_4_ = fVar223 * fVar206;
          auVar65._16_4_ = fVar224 * fVar208;
          auVar65._20_4_ = fVar225 * fVar210;
          auVar65._24_4_ = fVar226 * fVar212;
          auVar65._28_4_ = auVar33._28_4_;
          auVar66._4_4_ = fVar221 * fVar151;
          auVar66._0_4_ = fVar218 * fVar146;
          auVar66._8_4_ = fVar222 * fVar152;
          auVar66._12_4_ = fVar223 * fVar153;
          auVar66._16_4_ = fVar224 * fVar154;
          auVar66._20_4_ = fVar225 * fVar155;
          auVar66._24_4_ = fVar226 * fVar156;
          auVar66._28_4_ = uVar86;
          auVar33 = vsubps_avx(auVar64,auVar65);
          auVar34 = vsubps_avx(auVar66,auVar63);
          auVar88 = vandps_avx(auVar177,auVar65);
          auVar32 = vandps_avx(auVar177,auVar63);
          auVar32 = vcmpps_avx(auVar88,auVar32,1);
          local_1380 = vblendvps_avx(auVar34,auVar33,auVar32);
          auVar87 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
          fVar167 = local_1380._0_4_;
          fVar145 = local_1380._4_4_;
          fVar169 = local_1380._8_4_;
          fVar106 = local_1380._12_4_;
          fVar107 = local_1380._16_4_;
          fVar108 = local_1380._20_4_;
          fVar109 = local_1380._24_4_;
          fVar171 = local_13a0._0_4_;
          fVar173 = local_13a0._4_4_;
          fVar175 = local_13a0._8_4_;
          fVar180 = local_13a0._12_4_;
          fVar181 = local_13a0._16_4_;
          fVar182 = local_13a0._20_4_;
          fVar183 = local_13a0._24_4_;
          fVar98 = local_13c0._0_4_;
          fVar105 = local_13c0._4_4_;
          fVar27 = local_13c0._8_4_;
          fVar28 = local_13c0._12_4_;
          fVar29 = local_13c0._16_4_;
          fVar30 = local_13c0._20_4_;
          fVar31 = local_13c0._24_4_;
          fVar159 = local_1100 * fVar98 + fVar167 * fVar104 + fVar171 * fVar97;
          fVar94 = local_1100 * fVar105 + fVar145 * fVar104 + fVar173 * fVar97;
          fVar163 = local_1100 * fVar27 + fVar169 * fVar104 + fVar175 * fVar97;
          fVar95 = local_1100 * fVar28 + fVar106 * fVar104 + fVar180 * fVar97;
          fVar165 = local_1100 * fVar29 + fVar107 * fVar104 + fVar181 * fVar97;
          fVar96 = local_1100 * fVar30 + fVar108 * fVar104 + fVar182 * fVar97;
          fVar97 = local_1100 * fVar31 + fVar109 * fVar104 + fVar183 * fVar97;
          fVar104 = auVar114._28_4_ + auVar114._28_4_ + 0.0;
          auVar89._0_4_ = fVar159 + fVar159;
          auVar89._4_4_ = fVar94 + fVar94;
          auVar89._8_4_ = fVar163 + fVar163;
          auVar89._12_4_ = fVar95 + fVar95;
          auVar89._16_4_ = fVar165 + fVar165;
          auVar89._20_4_ = fVar96 + fVar96;
          auVar89._24_4_ = fVar97 + fVar97;
          auVar89._28_4_ = fVar104 + fVar104;
          fVar159 = fVar98 * fVar14 + fVar167 * fVar13 + fVar171 * fVar2;
          fVar119 = fVar105 * fVar119 + fVar145 * fVar16 + fVar173 * fVar15;
          fVar120 = fVar27 * fVar122 + fVar169 * fVar121 + fVar175 * fVar120;
          fVar121 = fVar28 * fVar17 + fVar106 * fVar124 + fVar180 * fVar123;
          fVar122 = fVar29 * fVar20 + fVar107 * fVar19 + fVar181 * fVar18;
          fVar123 = fVar30 * fVar23 + fVar108 * fVar22 + fVar182 * fVar21;
          fVar124 = fVar31 * fVar26 + fVar109 * fVar25 + fVar183 * fVar24;
          auVar114 = vrcpps_avx(auVar89);
          fVar97 = auVar114._0_4_;
          fVar104 = auVar114._4_4_;
          auVar67._4_4_ = auVar89._4_4_ * fVar104;
          auVar67._0_4_ = auVar89._0_4_ * fVar97;
          fVar2 = auVar114._8_4_;
          auVar67._8_4_ = auVar89._8_4_ * fVar2;
          fVar13 = auVar114._12_4_;
          auVar67._12_4_ = auVar89._12_4_ * fVar13;
          fVar14 = auVar114._16_4_;
          auVar67._16_4_ = auVar89._16_4_ * fVar14;
          fVar15 = auVar114._20_4_;
          auVar67._20_4_ = auVar89._20_4_ * fVar15;
          fVar16 = auVar114._24_4_;
          auVar67._24_4_ = auVar89._24_4_ * fVar16;
          auVar67._28_4_ = auVar88._28_4_;
          auVar148._8_4_ = 0x3f800000;
          auVar148._0_8_ = &DAT_3f8000003f800000;
          auVar148._12_4_ = 0x3f800000;
          auVar148._16_4_ = 0x3f800000;
          auVar148._20_4_ = 0x3f800000;
          auVar148._24_4_ = 0x3f800000;
          auVar148._28_4_ = 0x3f800000;
          auVar88 = vsubps_avx(auVar148,auVar67);
          local_1300._4_4_ = (fVar119 + fVar119) * (fVar104 + fVar104 * auVar88._4_4_);
          local_1300._0_4_ = (fVar159 + fVar159) * (fVar97 + fVar97 * auVar88._0_4_);
          local_1300._8_4_ = (fVar120 + fVar120) * (fVar2 + fVar2 * auVar88._8_4_);
          local_1300._12_4_ = (fVar121 + fVar121) * (fVar13 + fVar13 * auVar88._12_4_);
          local_1300._16_4_ = (fVar122 + fVar122) * (fVar14 + fVar14 * auVar88._16_4_);
          local_1300._20_4_ = (fVar123 + fVar123) * (fVar15 + fVar15 * auVar88._20_4_);
          local_1300._24_4_ = (fVar124 + fVar124) * (fVar16 + fVar16 * auVar88._24_4_);
          local_1300._28_4_ = local_11a0._28_4_;
          auVar93 = ZEXT3264(local_1300);
          uVar86 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar116._4_4_ = uVar86;
          auVar116._0_4_ = uVar86;
          auVar116._8_4_ = uVar86;
          auVar116._12_4_ = uVar86;
          auVar116._16_4_ = uVar86;
          auVar116._20_4_ = uVar86;
          auVar116._24_4_ = uVar86;
          auVar116._28_4_ = uVar86;
          auVar88 = vcmpps_avx(auVar116,local_1300,2);
          uVar86 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar129._4_4_ = uVar86;
          auVar129._0_4_ = uVar86;
          auVar129._8_4_ = uVar86;
          auVar129._12_4_ = uVar86;
          auVar129._16_4_ = uVar86;
          auVar129._20_4_ = uVar86;
          auVar129._24_4_ = uVar86;
          auVar129._28_4_ = uVar86;
          auVar114 = vcmpps_avx(local_1300,auVar129,2);
          auVar88 = vandps_avx(auVar114,auVar88);
          auVar99 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
          auVar87 = vpand_avx(auVar99,auVar87);
          auVar99 = vpmovsxwd_avx(auVar87);
          auVar110 = vpshufd_avx(auVar87,0xee);
          auVar110 = vpmovsxwd_avx(auVar110);
          auVar117._16_16_ = auVar110;
          auVar117._0_16_ = auVar99;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0x7f,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar110 >> 0x3f,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0xf] < '\0') {
            auVar88 = vcmpps_avx(auVar89,_DAT_02020f00,4);
            auVar99 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
            auVar87 = vpand_avx(auVar87,auVar99);
            auVar99 = vpmovsxwd_avx(auVar87);
            auVar110 = vpunpckhwd_avx(auVar87,auVar87);
            local_1500._16_16_ = auVar110;
            local_1500._0_16_ = auVar99;
            if ((((((((local_1500 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_1500 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_1500 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_1500 >> 0x7f,0) != '\0') ||
                  (local_1500 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar110 >> 0x3f,0) != '\0') ||
                (local_1500 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar110[0xf] < '\0') {
              local_1420 = auVar187;
              local_1400 = local_1520;
              local_13e0 = local_1220;
              auVar88 = vrcpps_avx(local_1220);
              fVar97 = auVar88._0_4_;
              fVar104 = auVar88._4_4_;
              auVar68._4_4_ = local_1220._4_4_ * fVar104;
              auVar68._0_4_ = local_1220._0_4_ * fVar97;
              fVar2 = auVar88._8_4_;
              auVar68._8_4_ = local_1220._8_4_ * fVar2;
              fVar13 = auVar88._12_4_;
              auVar68._12_4_ = local_1220._12_4_ * fVar13;
              fVar14 = auVar88._16_4_;
              auVar68._16_4_ = local_1220._16_4_ * fVar14;
              fVar15 = auVar88._20_4_;
              auVar68._20_4_ = local_1220._20_4_ * fVar15;
              fVar16 = auVar88._24_4_;
              auVar68._24_4_ = local_1220._24_4_ * fVar16;
              auVar68._28_4_ = local_1220._28_4_;
              auVar178._8_4_ = 0x3f800000;
              auVar178._0_8_ = &DAT_3f8000003f800000;
              auVar178._12_4_ = 0x3f800000;
              auVar178._16_4_ = 0x3f800000;
              auVar178._20_4_ = 0x3f800000;
              auVar178._24_4_ = 0x3f800000;
              auVar178._28_4_ = 0x3f800000;
              auVar114 = vsubps_avx(auVar178,auVar68);
              auVar139._0_4_ = fVar97 + fVar97 * auVar114._0_4_;
              auVar139._4_4_ = fVar104 + fVar104 * auVar114._4_4_;
              auVar139._8_4_ = fVar2 + fVar2 * auVar114._8_4_;
              auVar139._12_4_ = fVar13 + fVar13 * auVar114._12_4_;
              auVar139._16_4_ = fVar14 + fVar14 * auVar114._16_4_;
              auVar139._20_4_ = fVar15 + fVar15 * auVar114._20_4_;
              auVar139._24_4_ = fVar16 + fVar16 * auVar114._24_4_;
              auVar139._28_4_ = auVar88._28_4_ + auVar114._28_4_;
              auVar149._8_4_ = 0x219392ef;
              auVar149._0_8_ = 0x219392ef219392ef;
              auVar149._12_4_ = 0x219392ef;
              auVar149._16_4_ = 0x219392ef;
              auVar149._20_4_ = 0x219392ef;
              auVar149._24_4_ = 0x219392ef;
              auVar149._28_4_ = 0x219392ef;
              auVar114 = vcmpps_avx(local_1200,auVar149,5);
              auVar88 = vandps_avx(auVar114,auVar139);
              local_1360 = local_1500;
              local_1280 = local_1240;
              auVar69._4_4_ = auVar187._4_4_ * auVar88._4_4_;
              auVar69._0_4_ = auVar187._0_4_ * auVar88._0_4_;
              auVar69._8_4_ = auVar187._8_4_ * auVar88._8_4_;
              auVar69._12_4_ = auVar187._12_4_ * auVar88._12_4_;
              auVar69._16_4_ = auVar187._16_4_ * auVar88._16_4_;
              auVar69._20_4_ = auVar187._20_4_ * auVar88._20_4_;
              auVar69._24_4_ = auVar187._24_4_ * auVar88._24_4_;
              auVar69._28_4_ = auVar114._28_4_;
              auVar114 = vminps_avx(auVar69,auVar178);
              auVar70._4_4_ = local_1520._4_4_ * auVar88._4_4_;
              auVar70._0_4_ = local_1520._0_4_ * auVar88._0_4_;
              auVar70._8_4_ = local_1520._8_4_ * auVar88._8_4_;
              auVar70._12_4_ = local_1520._12_4_ * auVar88._12_4_;
              auVar70._16_4_ = local_1520._16_4_ * auVar88._16_4_;
              auVar70._20_4_ = local_1520._20_4_ * auVar88._20_4_;
              auVar70._24_4_ = local_1520._24_4_ * auVar88._24_4_;
              auVar70._28_4_ = auVar88._28_4_;
              auVar88 = vminps_avx(auVar70,auVar178);
              auVar32 = vsubps_avx(auVar178,auVar114);
              local_1320 = vblendvps_avx(auVar88,auVar32,local_1240);
              auVar88 = vsubps_avx(auVar178,auVar88);
              local_1340 = vblendvps_avx(auVar114,auVar88,local_1240);
              fVar97 = local_1260._0_4_;
              fVar104 = local_1260._4_4_;
              fVar2 = local_1260._8_4_;
              fVar13 = local_1260._12_4_;
              fVar14 = local_1260._16_4_;
              fVar15 = local_1260._20_4_;
              fVar16 = local_1260._24_4_;
              uStack_12c4 = local_1340._28_4_;
              local_12e0[0] = fVar98 * fVar97;
              local_12e0[1] = fVar105 * fVar104;
              local_12e0[2] = fVar27 * fVar2;
              local_12e0[3] = fVar28 * fVar13;
              fStack_12d0 = fVar29 * fVar14;
              fStack_12cc = fVar30 * fVar15;
              fStack_12c8 = fVar31 * fVar16;
              local_12c0[0] = fVar171 * fVar97;
              local_12c0[1] = fVar173 * fVar104;
              local_12c0[2] = fVar175 * fVar2;
              local_12c0[3] = fVar180 * fVar13;
              fStack_12b0 = fVar181 * fVar14;
              fStack_12ac = fVar182 * fVar15;
              fStack_12a8 = fVar183 * fVar16;
              uStack_12a4 = uStack_12c4;
              auVar118._16_16_ = auVar110;
              auVar118._0_16_ = auVar99;
              auVar130._8_4_ = 0x7f800000;
              auVar130._0_8_ = 0x7f8000007f800000;
              auVar130._12_4_ = 0x7f800000;
              auVar130._16_4_ = 0x7f800000;
              auVar130._20_4_ = 0x7f800000;
              auVar130._24_4_ = 0x7f800000;
              auVar130._28_4_ = 0x7f800000;
              auVar88 = vblendvps_avx(auVar130,local_1300,auVar118);
              local_12a0[0] = fVar97 * fVar167;
              local_12a0[1] = fVar104 * fVar145;
              local_12a0[2] = fVar2 * fVar169;
              local_12a0[3] = fVar13 * fVar106;
              fStack_1290 = fVar14 * fVar107;
              fStack_128c = fVar15 * fVar108;
              fStack_1288 = fVar16 * fVar109;
              uStack_1284 = uStack_12c4;
              auVar114 = vshufps_avx(auVar88,auVar88,0xb1);
              auVar114 = vminps_avx(auVar88,auVar114);
              auVar32 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar32);
              auVar32 = vperm2f128_avx(auVar114,auVar114,1);
              auVar114 = vminps_avx(auVar114,auVar32);
              auVar88 = vcmpps_avx(auVar88,auVar114,0);
              auVar99 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
              auVar87 = vpand_avx(auVar99,auVar87);
              auVar99 = vpmovsxwd_avx(auVar87);
              auVar87 = vpunpckhwd_avx(auVar87,auVar87);
              auVar101._16_16_ = auVar87;
              auVar101._0_16_ = auVar99;
              if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar101 >> 0x7f,0) == '\0') &&
                    (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar87 >> 0x3f,0) == '\0') &&
                  (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar87[0xf]) {
                auVar101 = local_1500;
              }
              uVar73 = vmovmskps_avx(auVar101);
              uVar78 = 0;
              local_11a0 = auVar43;
              if (uVar73 != 0) {
                for (; (uVar73 >> uVar78 & 1) == 0; uVar78 = uVar78 + 1) {
                }
              }
LAB_003e6ba5:
              uVar81 = (ulong)uVar78;
              uVar78 = *(uint *)((long)&local_10e0 + uVar81 * 4);
              pGVar11 = (pSVar5->geometries).items[uVar78].ptr;
              if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_1500 + uVar81 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar86 = *(undefined4 *)(local_1340 + uVar81 * 4);
                  uVar3 = *(undefined4 *)(local_1320 + uVar81 * 4);
                  *(float *)(ray + k * 4 + 0x100) = local_12e0[uVar81 - 8];
                  *(float *)(ray + k * 4 + 0x180) = local_12e0[uVar81];
                  *(float *)(ray + k * 4 + 0x1a0) = local_12c0[uVar81];
                  *(float *)(ray + k * 4 + 0x1c0) = local_12a0[uVar81];
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar86;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)((long)&local_1440 + uVar81 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar78;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  goto LAB_003e705a;
                }
                local_1060 = *(undefined4 *)(local_1340 + uVar81 * 4);
                local_1040 = *(undefined4 *)(local_1320 + uVar81 * 4);
                local_1020 = *(undefined4 *)((long)&local_1440 + uVar81 * 4);
                fVar97 = local_12e0[uVar81];
                fVar104 = local_12c0[uVar81];
                local_10a0._4_4_ = fVar104;
                local_10a0._0_4_ = fVar104;
                local_10a0._8_4_ = fVar104;
                local_10a0._12_4_ = fVar104;
                local_10a0._16_4_ = fVar104;
                local_10a0._20_4_ = fVar104;
                local_10a0._24_4_ = fVar104;
                local_10a0._28_4_ = fVar104;
                auStack_ff0 = vpshufd_avx(ZEXT416(uVar78),0);
                fVar104 = local_12a0[uVar81];
                local_1080._4_4_ = fVar104;
                local_1080._0_4_ = fVar104;
                local_1080._8_4_ = fVar104;
                local_1080._12_4_ = fVar104;
                local_1080._16_4_ = fVar104;
                local_1080._20_4_ = fVar104;
                local_1080._24_4_ = fVar104;
                local_1080._28_4_ = fVar104;
                local_10c0[0] = (RTCHitN)SUB41(fVar97,0);
                local_10c0[1] = (RTCHitN)(char)((uint)fVar97 >> 8);
                local_10c0[2] = (RTCHitN)(char)((uint)fVar97 >> 0x10);
                local_10c0[3] = (RTCHitN)(char)((uint)fVar97 >> 0x18);
                local_10c0[4] = (RTCHitN)SUB41(fVar97,0);
                local_10c0[5] = (RTCHitN)(char)((uint)fVar97 >> 8);
                local_10c0[6] = (RTCHitN)(char)((uint)fVar97 >> 0x10);
                local_10c0[7] = (RTCHitN)(char)((uint)fVar97 >> 0x18);
                local_10c0[8] = (RTCHitN)SUB41(fVar97,0);
                local_10c0[9] = (RTCHitN)(char)((uint)fVar97 >> 8);
                local_10c0[10] = (RTCHitN)(char)((uint)fVar97 >> 0x10);
                local_10c0[0xb] = (RTCHitN)(char)((uint)fVar97 >> 0x18);
                local_10c0[0xc] = (RTCHitN)SUB41(fVar97,0);
                local_10c0[0xd] = (RTCHitN)(char)((uint)fVar97 >> 8);
                local_10c0[0xe] = (RTCHitN)(char)((uint)fVar97 >> 0x10);
                local_10c0[0xf] = (RTCHitN)(char)((uint)fVar97 >> 0x18);
                local_10c0[0x10] = (RTCHitN)SUB41(fVar97,0);
                local_10c0[0x11] = (RTCHitN)(char)((uint)fVar97 >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)fVar97 >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)fVar97 >> 0x18);
                local_10c0[0x14] = (RTCHitN)SUB41(fVar97,0);
                local_10c0[0x15] = (RTCHitN)(char)((uint)fVar97 >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)fVar97 >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)fVar97 >> 0x18);
                local_10c0[0x18] = (RTCHitN)SUB41(fVar97,0);
                local_10c0[0x19] = (RTCHitN)(char)((uint)fVar97 >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar97 >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar97 >> 0x18);
                local_10c0[0x1c] = (RTCHitN)SUB41(fVar97,0);
                local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar97 >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar97 >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar97 >> 0x18);
                uStack_105c = local_1060;
                uStack_1058 = local_1060;
                uStack_1054 = local_1060;
                uStack_1050 = local_1060;
                uStack_104c = local_1060;
                uStack_1048 = local_1060;
                uStack_1044 = local_1060;
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                uStack_101c = local_1020;
                uStack_1018 = local_1020;
                uStack_1014 = local_1020;
                uStack_1010 = local_1020;
                uStack_100c = local_1020;
                uStack_1008 = local_1020;
                uStack_1004 = local_1020;
                local_1000 = auStack_ff0;
                auVar88 = vcmpps_avx(ZEXT1632(auStack_ff0),ZEXT1632(auStack_ff0),0xf);
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                uVar86 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(float *)(ray + k * 4 + 0x100) = local_12e0[uVar81 - 8];
                local_1580 = *(undefined8 *)(mm_lookupmask_ps + uVar76);
                uStack_1578 = *(undefined8 *)(mm_lookupmask_ps + uVar76 + 8);
                local_1570 = *(undefined8 *)(mm_lookupmask_ps + lVar77);
                uStack_1568 = *(undefined8 *)(mm_lookupmask_ps + lVar77 + 8);
                local_1550.valid = (int *)&local_1580;
                local_1550.geometryUserPtr = pGVar11->userPtr;
                local_1550.context = context->user;
                local_1550.hit = local_10c0;
                local_1550.N = 8;
                local_1550.ray = (RTCRayN *)ray;
                if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  local_1520._0_8_ = pauVar83;
                  auVar88 = ZEXT1632(auVar88._0_16_);
                  (*pGVar11->intersectionFilterN)(&local_1550);
                  auVar93 = ZEXT3264(auVar93._0_32_);
                  auVar88 = vcmpps_avx(auVar88,auVar88,0xf);
                  pauVar83 = (undefined1 (*) [16])local_1520._0_8_;
                }
                auVar39._8_8_ = uStack_1578;
                auVar39._0_8_ = local_1580;
                auVar87 = vpcmpeqd_avx((undefined1  [16])0x0,auVar39);
                auVar40._8_8_ = uStack_1568;
                auVar40._0_8_ = local_1570;
                auVar99 = vpcmpeqd_avx((undefined1  [16])0x0,auVar40);
                auVar90._16_16_ = auVar99;
                auVar90._0_16_ = auVar87;
                auVar114 = auVar88 & ~auVar90;
                if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar114 >> 0x7f,0) == '\0') &&
                      (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar114 >> 0xbf,0) == '\0') &&
                    (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar114[0x1f]) {
                  auVar91._0_4_ = auVar87._0_4_ ^ auVar88._0_4_;
                  auVar91._4_4_ = auVar87._4_4_ ^ auVar88._4_4_;
                  auVar91._8_4_ = auVar87._8_4_ ^ auVar88._8_4_;
                  auVar91._12_4_ = auVar87._12_4_ ^ auVar88._12_4_;
                  auVar91._16_4_ = auVar99._0_4_ ^ auVar88._16_4_;
                  auVar91._20_4_ = auVar99._4_4_ ^ auVar88._20_4_;
                  auVar91._24_4_ = auVar99._8_4_ ^ auVar88._24_4_;
                  auVar91._28_4_ = auVar99._12_4_ ^ auVar88._28_4_;
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar88 = ZEXT1632(auVar88._0_16_);
                    (*p_Var12)(&local_1550);
                    auVar93 = ZEXT3264(auVar93._0_32_);
                    auVar88 = vcmpps_avx(auVar88,auVar88,0xf);
                  }
                  auVar41._8_8_ = uStack_1578;
                  auVar41._0_8_ = local_1580;
                  auVar87 = vpcmpeqd_avx((undefined1  [16])0x0,auVar41);
                  auVar42._8_8_ = uStack_1568;
                  auVar42._0_8_ = local_1570;
                  auVar99 = vpcmpeqd_avx((undefined1  [16])0x0,auVar42);
                  auVar103._16_16_ = auVar99;
                  auVar103._0_16_ = auVar87;
                  auVar91._0_4_ = auVar87._0_4_ ^ auVar88._0_4_;
                  auVar91._4_4_ = auVar87._4_4_ ^ auVar88._4_4_;
                  auVar91._8_4_ = auVar87._8_4_ ^ auVar88._8_4_;
                  auVar91._12_4_ = auVar87._12_4_ ^ auVar88._12_4_;
                  auVar91._16_4_ = auVar99._0_4_ ^ auVar88._16_4_;
                  auVar91._20_4_ = auVar99._4_4_ ^ auVar88._20_4_;
                  auVar91._24_4_ = auVar99._8_4_ ^ auVar88._24_4_;
                  auVar91._28_4_ = auVar99._12_4_ ^ auVar88._28_4_;
                  auVar88 = auVar88 & ~auVar103;
                  if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar88 >> 0x7f,0) != '\0') ||
                        (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar88 >> 0xbf,0) != '\0') ||
                      (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar88[0x1f] < '\0') {
                    auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])local_1550.hit);
                    *(undefined1 (*) [32])(local_1550.ray + 0x180) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(local_1550.hit + 0x20));
                    *(undefined1 (*) [32])(local_1550.ray + 0x1a0) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(local_1550.hit + 0x40));
                    *(undefined1 (*) [32])(local_1550.ray + 0x1c0) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(local_1550.hit + 0x60));
                    *(undefined1 (*) [32])(local_1550.ray + 0x1e0) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(local_1550.hit + 0x80));
                    *(undefined1 (*) [32])(local_1550.ray + 0x200) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(local_1550.hit + 0xa0));
                    *(undefined1 (*) [32])(local_1550.ray + 0x220) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(local_1550.hit + 0xc0));
                    *(undefined1 (*) [32])(local_1550.ray + 0x240) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(local_1550.hit + 0xe0));
                    *(undefined1 (*) [32])(local_1550.ray + 0x260) = auVar88;
                    auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])(local_1550.hit + 0x100))
                    ;
                    *(undefined1 (*) [32])(local_1550.ray + 0x280) = auVar88;
                  }
                }
                if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar91 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar91 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar91 >> 0x7f,0) == '\0') &&
                      (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar91 >> 0xbf,0) == '\0') &&
                    (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar91[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar86;
                }
                *(undefined4 *)(local_1500 + uVar81 * 4) = 0;
                uVar86 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar92._4_4_ = uVar86;
                auVar92._0_4_ = uVar86;
                auVar92._8_4_ = uVar86;
                auVar92._12_4_ = uVar86;
                auVar92._16_4_ = uVar86;
                auVar92._20_4_ = uVar86;
                auVar92._24_4_ = uVar86;
                auVar92._28_4_ = uVar86;
                auVar88 = vcmpps_avx(auVar93._0_32_,auVar92,2);
                local_1500 = vandps_avx(auVar88,local_1500);
              }
              if ((((((((local_1500 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1500 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1500 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1500 >> 0x7f,0) == '\0') &&
                    (local_1500 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_1500 >> 0xbf,0) == '\0') &&
                  (local_1500 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_1500[0x1f]) goto LAB_003e705a;
              auVar102._8_4_ = 0x7f800000;
              auVar102._0_8_ = 0x7f8000007f800000;
              auVar102._12_4_ = 0x7f800000;
              auVar102._16_4_ = 0x7f800000;
              auVar102._20_4_ = 0x7f800000;
              auVar102._24_4_ = 0x7f800000;
              auVar102._28_4_ = 0x7f800000;
              auVar88 = vblendvps_avx(auVar102,auVar93._0_32_,local_1500);
              auVar114 = vshufps_avx(auVar88,auVar88,0xb1);
              auVar114 = vminps_avx(auVar88,auVar114);
              auVar32 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar32);
              auVar32 = vperm2f128_avx(auVar114,auVar114,1);
              auVar114 = vminps_avx(auVar114,auVar32);
              auVar114 = vcmpps_avx(auVar88,auVar114,0);
              auVar32 = local_1500 & auVar114;
              auVar88 = local_1500;
              if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar32 >> 0x7f,0) != '\0') ||
                    (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar32 >> 0xbf,0) != '\0') ||
                  (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar32[0x1f] < '\0') {
                auVar88 = vandps_avx(auVar114,local_1500);
              }
              uVar73 = vmovmskps_avx(auVar88);
              uVar78 = 0;
              if (uVar73 != 0) {
                for (; (uVar73 >> uVar78 & 1) == 0; uVar78 = uVar78 + 1) {
                }
              }
              goto LAB_003e6ba5;
            }
          }
        }
LAB_003e705a:
        lVar75 = lVar75 + 1;
      } while (lVar75 != uVar84 - 8);
    }
    uVar86 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar93 = ZEXT1664(CONCAT412(uVar86,CONCAT48(uVar86,CONCAT44(uVar86,uVar86))));
    auVar158 = ZEXT1664(local_1450);
    auVar162 = ZEXT1664(local_1460);
    auVar179 = ZEXT1664(local_1470);
    auVar188 = ZEXT1664(local_1480);
    auVar191 = ZEXT1664(local_1490);
    auVar201 = ZEXT1664(local_14a0);
    auVar215 = ZEXT1664(local_14b0);
    auVar217 = ZEXT1664(local_14c0);
    auVar220 = ZEXT1664(local_14d0);
    auVar150 = ZEXT1664(local_14e0);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }